

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O3

pnode_t * append_transcript_word
                    (s3wid_t w,pnode_t *prev_end,s3wid_t nextw,int32 prefix_filler,
                    int32 append_filler)

{
  pnode_s *ppVar1;
  pnode_t *ppVar2;
  long lVar3;
  pnode_t *ppVar4;
  pnode_t *ppVar5;
  pnode_s *ppVar6;
  uint w_00;
  s3cipid_t succ_ci [256];
  s3cipid_t pred_ci [256];
  s3cipid_t local_438 [256];
  s3cipid_t local_238 [260];
  
  if (0xff < mdef->n_ciphone) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
            ,0x1d5,"Increase pred_ci, succ_ci array sizes to > #CIphones (%d)\n");
    exit(1);
  }
  if (prev_end == (pnode_t *)0x0) {
    __assert_fail("prev_end != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                  ,0x1d6,
                  "pnode_t *append_transcript_word(s3wid_t, pnode_t *, s3wid_t, int32, int32)");
  }
  if (prefix_filler != 0) {
    build_pred_ci(prev_end,local_238);
    ppVar2 = (pnode_t *)0x0;
    build_succ_ci(w,0,local_438);
    w_00 = *fillwid;
    ppVar6 = prev_end;
    if (-1 < (int)w_00) {
      lVar3 = 0;
      ppVar5 = (pnode_s *)0x0;
      do {
        do {
          ppVar2 = append_word(w_00,prev_end,local_238,local_438);
          ppVar6 = ppVar2;
          do {
            ppVar4 = ppVar6;
            ppVar6 = ppVar4->next;
          } while (ppVar6 != (pnode_s *)0x0);
          ppVar4->next = ppVar5;
          w_00 = dict->word[w_00].alt;
          ppVar5 = ppVar2;
        } while (-1 < (int)w_00);
        w_00 = fillwid[lVar3 + 1];
        lVar3 = lVar3 + 1;
        ppVar6 = prev_end;
      } while (-1 < (int)w_00);
    }
    do {
      ppVar5 = ppVar6;
      ppVar6 = ppVar5->next;
    } while (ppVar6 != (pnode_s *)0x0);
    ppVar5->next = ppVar2;
  }
  build_pred_ci(prev_end,local_238);
  build_succ_ci(nextw,append_filler,local_438);
  if (w < 0) {
    ppVar2 = (pnode_t *)0x0;
  }
  else {
    ppVar6 = (pnode_s *)0x0;
    do {
      ppVar2 = append_word(w,prev_end,local_238,local_438);
      ppVar1 = ppVar2;
      do {
        ppVar5 = ppVar1;
        ppVar1 = ppVar5->next;
      } while (ppVar1 != (pnode_s *)0x0);
      ppVar5->next = ppVar6;
      w = dict->word[(uint)w].alt;
      ppVar6 = ppVar2;
    } while (-1 < w);
  }
  return ppVar2;
}

Assistant:

static pnode_t *
append_transcript_word(s3wid_t w,
                                /** Transcript word to be appended */
                       pnode_t * prev_end,
                                /** Previous end points to be attached to w */
                       s3wid_t nextw,
                                /** Next word to follow w (ignoring optional fillers) */
                       int32 prefix_filler,
                                /** Whether optional filler words to precede w */
                       int32 append_filler)
{
/** Whether optional filler words to follow w */
    int32 i;
    pnode_t *new_end, *tmp_end, *node;
    s3cipid_t pred_ci[256], succ_ci[256];
    s3wid_t fw;

    if (mdef->n_ciphone >= 256)
        E_FATAL
            ("Increase pred_ci, succ_ci array sizes to > #CIphones (%d)\n",
             mdef->n_ciphone);
    assert(prev_end != NULL);

    /* Add optional silence/filler words before w, if indicated */
    if (prefix_filler) {
        build_pred_ci(prev_end, pred_ci);       /* Predecessor CI list for fillers */
        build_succ_ci(w, 0, succ_ci);   /* Successor CI list for fillers */

        new_end = NULL;
        for (i = 0; IS_S3WID(fillwid[i]); i++) {
            for (fw = fillwid[i]; IS_S3WID(fw); fw = dict->word[fw].alt) {
                tmp_end = append_word(fw, prev_end, pred_ci, succ_ci);

                for (node = tmp_end; node->next; node = node->next);
                node->next = new_end;
                new_end = tmp_end;
            }
        }

        /* Augment prev_end with new_end for filler words added above */
        for (node = prev_end; node->next; node = node->next);
        node->next = new_end;
    }

    /* Add w */
    build_pred_ci(prev_end, pred_ci);   /* Predecessor CI list for w */
    build_succ_ci(nextw, append_filler, succ_ci);       /* Successor CI list for w */

    new_end = NULL;
    for (; IS_S3WID(w); w = dict->word[w].alt) {
        tmp_end = append_word(w, prev_end, pred_ci, succ_ci);

        for (node = tmp_end; node->next; node = node->next);
        node->next = new_end;
        new_end = tmp_end;
    }

    return (new_end);
}